

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O3

string * sago::getCacheDir_abi_cxx11_(void)

{
  string *in_RDI;
  
  getLinuxFolderDefault_abi_cxx11_(in_RDI,"XDG_CACHE_HOME",".cache");
  return in_RDI;
}

Assistant:

std::string getCacheDir() {
#ifdef _WIN32
	return GetAppDataLocal();
#elif defined(__APPLE__)
	return sago::internal::getHome()+"/Library/Caches";
#else
	return getLinuxFolderDefault("XDG_CACHE_HOME", ".cache");
#endif
}